

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

bool __thiscall QTextStreamPrivate::getChar(QTextStreamPrivate *this,QChar *ch)

{
  bool bVar1;
  QChar *pQVar2;
  
  if ((this->string == (QString *)0x0) || (this->stringOffset != (this->string->d).size)) {
    if ((this->device != (QIODevice *)0x0) && ((this->readBuffer).d.size == 0)) {
      bVar1 = fillReadBuffer(this,-1);
      if (!bVar1) goto LAB_002cf8fa;
    }
    if (ch != (QChar *)0x0) {
      pQVar2 = readPtr(this);
      ch->ucs = pQVar2->ucs;
    }
    consume(this,1);
    bVar1 = true;
  }
  else {
LAB_002cf8fa:
    if (ch != (QChar *)0x0) {
      ch->ucs = L'\0';
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool QTextStreamPrivate::getChar(QChar *ch)
{
    if ((string && stringOffset == string->size())
        || (device && readBuffer.isEmpty() && !fillReadBuffer())) {
        if (ch)
            *ch = QChar();
        return false;
    }
    if (ch)
        *ch = *readPtr();
    consume(1);
    return true;
}